

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O0

bool __thiscall
avro::BufferCopyInInputStream::next(BufferCopyInInputStream *this,uint8_t **data,size_t *size)

{
  bool bVar1;
  undefined8 *in_RDX;
  BufferCopyInInputStream *in_RSI;
  long in_RDI;
  
  if ((*(long *)(in_RDI + 0x30) == 0) && (bVar1 = fill(in_RSI), !bVar1)) {
    return false;
  }
  (in_RSI->super_InputStream)._vptr_InputStream = *(_func_int ***)(in_RDI + 0x28);
  *in_RDX = *(undefined8 *)(in_RDI + 0x30);
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x28);
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x20);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  return true;
}

Assistant:

bool next(const uint8_t** data, size_t *size) {
        if (available_ == 0 && ! fill()) {
            return false;
        }
        *data = next_;
        *size = available_;
        next_ += available_;
        byteCount_ += available_;
        available_ = 0;
        return true;
    }